

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ShadowTableName(sqlite3 *db,char *zName)

{
  char *pcVar1;
  Table *pTVar2;
  char *in_RSI;
  Table *in_RDI;
  Table *pTab;
  char *zTail;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  pcVar1 = strrchr(in_RSI,0x5f);
  if (pcVar1 == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    *pcVar1 = '\0';
    pTVar2 = sqlite3FindTable((sqlite3 *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (char *)in_RDI,in_RSI);
    *pcVar1 = '_';
    if (pTVar2 == (Table *)0x0) {
      iVar3 = 0;
    }
    else if (pTVar2->eTabType == '\x01') {
      iVar3 = sqlite3IsShadowTableOf
                        ((sqlite3 *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,in_RSI);
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ShadowTableName(sqlite3 *db, const char *zName){
  char *zTail;                  /* Pointer to the last "_" in zName */
  Table *pTab;                  /* Table that zName is a shadow of */
  zTail = strrchr(zName, '_');
  if( zTail==0 ) return 0;
  *zTail = 0;
  pTab = sqlite3FindTable(db, zName, 0);
  *zTail = '_';
  if( pTab==0 ) return 0;
  if( !IsVirtual(pTab) ) return 0;
  return sqlite3IsShadowTableOf(db, pTab, zName);
}